

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imleInline.hpp
# Opt level: O0

void __thiscall IMLE::reset(IMLE *this)

{
  long in_RDI;
  IMLE *in_stack_00000050;
  
  std::vector<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>::clear
            ((vector<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_> *)
             0x2f6edf);
  set_internal_parameters(in_stack_00000050);
  *(undefined4 *)(in_RDI + 0xf0) = 0;
  return;
}

Assistant:

IMLE_CLASS_TEMPLATE
void IMLE_base::reset()
{
    experts.clear();
    set_internal_parameters();

    noise_to_go = 0;
}